

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O1

void media_player2_player_skeleton_finalize(GObject *object)

{
  GType GVar1;
  long lVar2;
  long lVar3;
  
  GVar1 = media_player2_player_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  lVar3 = 0;
  do {
    g_value_unset(**(long **)(lVar2 + 0x20) + lVar3);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x168);
  g_free(**(undefined8 **)(lVar2 + 0x20));
  g_list_free_full(*(undefined8 *)(*(long *)(lVar2 + 0x20) + 8),_changed_property_free);
  if (*(long *)(*(long *)(lVar2 + 0x20) + 0x10) != 0) {
    g_source_destroy();
  }
  g_main_context_unref(*(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x18));
  g_mutex_clear(*(long *)(lVar2 + 0x20) + 0x20);
  lVar2 = g_type_check_class_cast(media_player2_player_skeleton_parent_class,0x50);
  (**(code **)(lVar2 + 0x30))(object);
  return;
}

Assistant:

static void
media_player2_player_skeleton_finalize (GObject *object)
{
  MediaPlayer2PlayerSkeleton *skeleton = MEDIA_PLAYER2_PLAYER_SKELETON (object);
  guint n;
  for (n = 0; n < 15; n++)
    g_value_unset (&skeleton->priv->properties[n]);
  g_free (skeleton->priv->properties);
  g_list_free_full (skeleton->priv->changed_properties, (GDestroyNotify) _changed_property_free);
  if (skeleton->priv->changed_properties_idle_source != NULL)
    g_source_destroy (skeleton->priv->changed_properties_idle_source);
  g_main_context_unref (skeleton->priv->context);
  g_mutex_clear (&skeleton->priv->lock);
  G_OBJECT_CLASS (media_player2_player_skeleton_parent_class)->finalize (object);
}